

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.H
# Opt level: O0

bool __thiscall
amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
          (FArrayBox *this,Box *bx,int scomp,int ncomp,IntVect *where)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *in_R8;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  Array4<const_double> *a;
  IntVect local_28c;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  undefined8 local_270;
  int local_268;
  undefined8 local_25c;
  int local_254;
  undefined8 local_250;
  int local_248;
  undefined8 local_240;
  int local_238;
  Array4<const_double> local_230;
  Array4<const_double> *local_1f0;
  int *local_1e8;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  undefined8 local_1c0;
  int local_1b8;
  undefined8 *local_1b0;
  undefined4 local_1a4;
  undefined4 uStack_1a0;
  int local_19c;
  undefined8 local_198;
  int local_190;
  undefined8 *local_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  int local_178;
  undefined4 local_174;
  undefined4 *local_170;
  undefined4 local_164;
  undefined4 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  Array4<const_double> *local_100;
  Dim3 local_f8;
  Dim3 local_e8;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_64;
  undefined8 *local_60;
  Dim3 local_58;
  undefined8 *local_48;
  int local_40;
  int iStack_3c;
  int local_38;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined4 local_14;
  int *local_10;
  double local_8;
  
  local_b0 = *(double **)(in_RDI + 0x10);
  local_b8 = (undefined8 *)(in_RDI + 0x18);
  local_bc = *(int *)(in_RDI + 0x34);
  local_64 = 0;
  local_90 = *(undefined4 *)local_b8;
  local_74 = 1;
  uStack_8c = *(undefined4 *)(in_RDI + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_84 = 2;
  local_d8.z = *(int *)(in_RDI + 0x20);
  local_10 = (int *)(in_RDI + 0x24);
  local_14 = 0;
  local_40 = *local_10 + 1;
  local_20 = in_RDI + 0x24;
  local_24 = 1;
  iStack_3c = *(int *)(in_RDI + 0x28) + 1;
  local_30 = in_RDI + 0x24;
  local_34 = 2;
  local_f8.z = *(int *)(in_RDI + 0x2c) + 1;
  local_f8.y = iStack_3c;
  local_f8.x = local_40;
  local_1e8 = in_R8;
  local_1e0 = in_ECX;
  local_1dc = in_EDX;
  local_1d8 = in_RSI;
  local_e8._0_8_ = local_f8._0_8_;
  local_e8.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_88 = local_d8.z;
  local_80 = local_b8;
  local_70 = local_b8;
  local_60 = local_b8;
  local_58._0_8_ = local_f8._0_8_;
  local_58.z = local_f8.z;
  local_48 = local_b8;
  local_38 = local_f8.z;
  Array4<const_double>::Array4(&local_230,local_b0,&local_c8,&local_e8,local_bc);
  local_1b0 = local_1d8;
  local_120 = local_1d8;
  local_124 = 0;
  local_1a4 = *(undefined4 *)local_1d8;
  local_130 = local_1d8;
  local_134 = 1;
  uStack_1a0 = *(undefined4 *)((long)local_1d8 + 4);
  local_250 = *local_1d8;
  local_140 = local_1d8;
  local_144 = 2;
  local_248 = *(int *)(local_1d8 + 1);
  local_188 = local_1d8;
  local_150 = (undefined8 *)((long)local_1d8 + 0xc);
  local_154 = 0;
  local_180 = *(undefined4 *)local_150;
  local_160 = (undefined4 *)((long)local_1d8 + 0xc);
  local_164 = 1;
  uStack_17c = *(undefined4 *)(local_1d8 + 2);
  local_270 = *local_150;
  local_170 = (undefined4 *)((long)local_1d8 + 0xc);
  local_174 = 2;
  local_268 = *(int *)((long)local_1d8 + 0x14);
  local_274 = local_1dc;
  local_25c = local_270;
  local_254 = local_268;
  local_240 = local_250;
  local_238 = local_248;
  local_1f0 = &local_230;
  local_1c0 = local_250;
  local_1b8 = local_248;
  local_19c = local_248;
  local_198 = local_270;
  local_190 = local_268;
  local_178 = local_268;
  do {
    if (local_1dc + local_1e0 <= local_274) {
      return false;
    }
    for (local_278 = local_238; local_278 <= local_254; local_278 = local_278 + 1) {
      for (local_27c = local_240._4_4_; local_27c <= local_25c._4_4_; local_27c = local_27c + 1) {
        for (local_280 = (int)local_240; local_280 <= (int)local_25c; local_280 = local_280 + 1) {
          local_100 = local_1f0;
          local_104 = local_280;
          local_108 = local_27c;
          local_10c = local_278;
          local_110 = local_274;
          local_8 = local_1f0->p
                    [(long)(local_280 - (local_1f0->begin).x) +
                     (long)(local_27c - (local_1f0->begin).y) * local_1f0->jstride +
                     (long)(local_278 - (local_1f0->begin).z) * local_1f0->kstride +
                     (long)local_274 * local_1f0->nstride];
          uVar1 = std::isnan(local_8);
          if ((uVar1 & 1) != 0) {
            IntVect::IntVect(&local_28c,local_280,local_27c,local_278);
            *(undefined8 *)local_1e8 = local_28c.vect._0_8_;
            local_1e8[2] = local_28c.vect[2];
            return true;
          }
        }
      }
    }
    local_274 = local_274 + 1;
  } while( true );
}

Assistant:

bool
FArrayBox::contains_nan (const Box& bx, int scomp, int ncomp, IntVect& where) const noexcept
{
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(scomp <  nComp());
    BL_ASSERT(ncomp <= nComp());
    BL_ASSERT(domain.contains(bx));

    const auto& a = this->array();
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        Array<int,1+AMREX_SPACEDIM> ha{0,AMREX_D_DECL(std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest())};
        Gpu::DeviceVector<int> dv(1+AMREX_SPACEDIM);
        int* p = dv.data();
        Gpu::htod_memcpy_async(p, ha.data(), sizeof(int)*ha.size());
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            int* flag = p;
            bool t = false;
            for (int n = scomp; n < scomp+ncomp; ++n) {
                t = t || amrex::isnan(a(i,j,k,n));
            }
            if (t && (*flag == 0)) {
                if (Gpu::Atomic::Exch(flag,1) == 0) {
                    AMREX_D_TERM(p[1] = i;,
                                 p[2] = j;,
                                 p[3] = k;);
                }
            }
        });
        Gpu::dtoh_memcpy_async(ha.data(), p, sizeof(int)*ha.size());
        Gpu::streamSynchronize();
        where = IntVect(AMREX_D_DECL(ha[1],ha[2],ha[3]));
        return ha[0];
    } else
#endif
    {
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (int n = scomp; n < scomp+ncomp; ++n) {
            for         (int k = lo.z; k <= hi.z; ++k) {
                for     (int j = lo.y; j <= hi.y; ++j) {
                    for (int i = lo.x; i <= hi.x; ++i) {
                        if (amrex::isnan(a(i,j,k,n))) {
                            where = IntVect(AMREX_D_DECL(i,j,k));
                            return true;
                        }
                    }
                }
            }
        }
        return false;
    }
}